

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O0

int json_object_array_move_cb(json_object *parent,size_t idx,json_object *value,void *priv)

{
  int *piVar1;
  undefined8 local_48;
  size_t len;
  json_pointer_get_result *from;
  int rc;
  void *priv_local;
  json_object *value_local;
  size_t idx_local;
  json_object *parent_local;
  
  local_48 = json_object_array_length(parent);
  if (parent == *priv) {
    local_48 = local_48 + 1;
  }
  if (local_48 < idx) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    parent_local._4_4_ = -1;
  }
  else {
    parent_local._4_4_ = json_object_array_insert_idx(parent,idx,value);
    if (parent_local._4_4_ < 0) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
    }
  }
  return parent_local._4_4_;
}

Assistant:

static int json_object_array_move_cb(struct json_object *parent, size_t idx,
                                     struct json_object *value, void *priv)
{
	int rc;
	struct json_pointer_get_result *from = priv;
	size_t len = json_object_array_length(parent);

	/**
	 * If it's the same array parent, it means that we removed
	 * and element from it, so the length is temporarily reduced
	 * by 1, which means that if we try to move an element to
	 * the last position, we need to check the current length + 1
	 */
	if (parent == from->parent)
		len++;

	if (idx > len)
	{
		// Note: will propagate back out through json_pointer_set_with_array_cb()
		errno = EINVAL;
		return -1;
	}

	rc = json_object_array_insert_idx(parent, idx, value);
	if (rc < 0)
		errno = EINVAL;
	return rc;
}